

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

string * cmSystemTools::FileExistsInParentDirectories
                   (string *__return_storage_ptr__,string *fname,string *directory,string *toplevel)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  allocator<char> local_e9;
  string local_e8;
  int local_c4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  byte local_99;
  undefined1 local_98 [8];
  string prevDir;
  string dir;
  undefined1 local_48 [8];
  string file;
  string *toplevel_local;
  string *directory_local;
  string *fname_local;
  string *path;
  
  file.field_2._8_8_ = toplevel;
  std::__cxx11::string::string((string *)local_48,(string *)fname);
  cmsys::SystemTools::ConvertToUnixSlashes((string *)local_48);
  std::__cxx11::string::string((string *)(prevDir.field_2._M_local_buf + 8),(string *)directory);
  cmsys::SystemTools::ConvertToUnixSlashes((string *)((long)&prevDir.field_2 + 8));
  std::__cxx11::string::string((string *)local_98);
  do {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&prevDir.field_2 + 8),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_98);
    if (!bVar1) goto LAB_0017e16f;
    local_99 = 0;
    std::operator+(&local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&prevDir.field_2 + 8),"/");
    std::operator+(__return_storage_ptr__,&local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    std::__cxx11::string::~string((string *)&local_c0);
    bVar1 = cmsys::SystemTools::FileExists(__return_storage_ptr__);
    if (bVar1) {
      local_99 = 1;
      local_c4 = 1;
    }
    else {
      uVar2 = std::__cxx11::string::size();
      uVar3 = std::__cxx11::string::size();
      if (uVar2 < uVar3) {
        local_c4 = 3;
      }
      else {
        std::__cxx11::string::operator=
                  ((string *)local_98,(string *)(prevDir.field_2._M_local_buf + 8));
        cmsys::SystemTools::GetParentDirectory(&local_e8,(string *)((long)&prevDir.field_2 + 8));
        std::__cxx11::string::operator=
                  ((string *)(prevDir.field_2._M_local_buf + 8),(string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        local_c4 = 0;
      }
    }
    if ((local_99 & 1) == 0) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
  } while (local_c4 == 0);
  if (local_c4 == 3) {
LAB_0017e16f:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_e9);
    std::allocator<char>::~allocator(&local_e9);
    local_c4 = 1;
  }
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)(prevDir.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::FileExistsInParentDirectories(
  const std::string& fname, const std::string& directory,
  const std::string& toplevel)
{
  std::string file = fname;
  cmSystemTools::ConvertToUnixSlashes(file);
  std::string dir = directory;
  cmSystemTools::ConvertToUnixSlashes(dir);
  std::string prevDir;
  while (dir != prevDir) {
    std::string path = dir + "/" + file;
    if (cmSystemTools::FileExists(path)) {
      return path;
    }
    if (dir.size() < toplevel.size()) {
      break;
    }
    prevDir = dir;
    dir = cmSystemTools::GetParentDirectory(dir);
  }
  return "";
}